

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

TextureCubeView *
glu::TextureTestUtil::getSubView
          (TextureCubeView *__return_storage_ptr__,TextureCubeView *view,int baseLevel,int maxLevel)

{
  int iVar1;
  int numLevels;
  int iVar2;
  int face;
  long lVar3;
  ConstPixelBufferAccess *levels [6];
  
  iVar1 = view->m_numLevels + -1;
  iVar2 = iVar1;
  if (baseLevel < iVar1) {
    iVar2 = baseLevel;
  }
  lVar3 = 0;
  if (baseLevel < 0) {
    iVar2 = 0;
  }
  for (; lVar3 != 6; lVar3 = lVar3 + 1) {
    levels[lVar3] = view->m_levels[lVar3] + iVar2;
  }
  if (maxLevel < iVar1) {
    iVar1 = maxLevel;
  }
  numLevels = 1;
  if (iVar2 <= maxLevel) {
    numLevels = (iVar1 - iVar2) + 1;
  }
  tcu::TextureCubeView::TextureCubeView(__return_storage_ptr__,numLevels,&levels);
  return __return_storage_ptr__;
}

Assistant:

static tcu::TextureCubeView getSubView (const tcu::TextureCubeView& view, int baseLevel, int maxLevel)
{
	const int							clampedBase	= de::clamp(baseLevel, 0, view.getNumLevels()-1);
	const int							clampedMax	= de::clamp(maxLevel, clampedBase, view.getNumLevels()-1);
	const int							numLevels	= clampedMax-clampedBase+1;
	const tcu::ConstPixelBufferAccess*	levels[tcu::CUBEFACE_LAST];

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		levels[face] = view.getFaceLevels((tcu::CubeFace)face) + clampedBase;

	return tcu::TextureCubeView(numLevels, levels);
}